

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_predict.c
# Opt level: O3

int TIFFPredictorCleanup(TIFF *tif)

{
  undefined1 auVar1 [16];
  uint8_t *puVar2;
  undefined1 auVar3 [16];
  
  puVar2 = tif->tif_data;
  if (puVar2 != (uint8_t *)0x0) {
    auVar1 = *(undefined1 (*) [16])(puVar2 + 0x58);
    auVar3._0_8_ = auVar1._8_8_;
    auVar3._8_4_ = auVar1._0_4_;
    auVar3._12_4_ = auVar1._4_4_;
    (tif->tif_tagmethods).vsetfield = (TIFFVSetMethod)auVar3._0_8_;
    (tif->tif_tagmethods).vgetfield = (TIFFVGetMethod)auVar3._8_8_;
    (tif->tif_tagmethods).printdir = *(TIFFPrintMethod *)(puVar2 + 0x68);
    tif->tif_setupdecode = *(TIFFBoolMethod *)(puVar2 + 0x70);
    tif->tif_setupencode = *(TIFFBoolMethod *)(puVar2 + 0x78);
    return 1;
  }
  __assert_fail("sp != 0",
                "/workspace/llm4binary/github/license_c_cmakelists/galkahana[P]PDF-Writer/LibTiff/tif_predict.c"
                ,0x40d,"int TIFFPredictorCleanup(TIFF *)");
}

Assistant:

int TIFFPredictorCleanup(TIFF *tif)
{
    TIFFPredictorState *sp = PredictorState(tif);

    assert(sp != 0);

    tif->tif_tagmethods.vgetfield = sp->vgetparent;
    tif->tif_tagmethods.vsetfield = sp->vsetparent;
    tif->tif_tagmethods.printdir = sp->printdir;
    tif->tif_setupdecode = sp->setupdecode;
    tif->tif_setupencode = sp->setupencode;

    return 1;
}